

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O2

void __thiscall ncnn::Convolution_x86_avx2::Convolution_x86_avx2(Convolution_x86_avx2 *this)

{
  Convolution::Convolution((Convolution *)&this->field_0x180);
  this->_vptr_Convolution_x86_avx2 = (_func_int **)0x32a2a0;
  *(undefined8 *)&this->field_0x180 = 0x32a328;
  (this->weight_data_packed).data = (void *)0x0;
  (this->weight_data_packed).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->weight_data_packed).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->weight_data_packed).elemsize + 4) = 0;
  (this->weight_data_packed).allocator = (Allocator *)0x0;
  (this->weight_data_packed).dims = 0;
  (this->weight_data_packed).w = 0;
  (this->weight_data_packed).w = 0;
  (this->weight_data_packed).h = 0;
  (this->weight_data_packed).d = 0;
  (this->weight_data_packed).c = 0;
  (this->weight_data_3x3_winograd23).allocator = (Allocator *)0x0;
  (this->weight_data_3x3_winograd23).dims = 0;
  (this->weight_data_3x3_winograd23).w = 0;
  (this->weight_data_3x3_winograd23).w = 0;
  (this->weight_data_3x3_winograd23).h = 0;
  (this->weight_data_3x3_winograd23).d = 0;
  (this->weight_data_3x3_winograd23).c = 0;
  (this->weight_data_3x3_winograd63).cstep = 0;
  (this->weight_data_3x3_winograd63).allocator = (Allocator *)0x0;
  (this->weight_data_3x3_winograd63).dims = 0;
  (this->weight_data_3x3_winograd63).w = 0;
  (this->weight_data_3x3_winograd63).w = 0;
  (this->weight_data_3x3_winograd63).h = 0;
  (this->weight_data_3x3_winograd63).d = 0;
  (this->weight_data_3x3_winograd63).c = 0;
  (this->weight_data_int8).data = (void *)0x0;
  (this->weight_data_int8).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->weight_data_int8).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->weight_data_int8).elemsize + 4) = 0;
  (this->weight_data_int8).allocator = (Allocator *)0x0;
  (this->weight_data_int8).dims = 0;
  (this->weight_data_int8).w = 0;
  (this->weight_data_int8).w = 0;
  (this->weight_data_int8).h = 0;
  (this->weight_data_int8).d = 0;
  (this->weight_data_int8).c = 0;
  (this->weight_data_3x3_winograd23_int8).cstep = 0;
  (this->weight_data_3x3_winograd23_int8).allocator = (Allocator *)0x0;
  (this->weight_data_3x3_winograd23_int8).dims = 0;
  (this->weight_data_3x3_winograd23_int8).w = 0;
  (this->weight_data_3x3_winograd23_int8).w = 0;
  (this->weight_data_3x3_winograd23_int8).h = 0;
  (this->weight_data_3x3_winograd23_int8).d = 0;
  (this->weight_data_3x3_winograd23_int8).c = 0;
  (this->weight_data_3x3_winograd23).elempack = 0;
  *(undefined1 (*) [32])&(this->weight_data_packed).cstep = ZEXT432(0) << 0x40;
  (this->weight_data_3x3_winograd63).elempack = 0;
  *(undefined1 (*) [32])&(this->weight_data_3x3_winograd23).cstep = ZEXT432(0) << 0x40;
  (this->weight_data_3x3_winograd23_int8).elempack = 0;
  *(undefined1 (*) [32])&(this->weight_data_int8).cstep = ZEXT432(0) << 0x40;
  this->field_0x18b = 1;
  this->field_0x191 = 1;
  this->activation = (Layer *)0x0;
  this->convolution_dilation1 = (Layer *)0x0;
  return;
}

Assistant:

Convolution_x86_avx2::Convolution_x86_avx2()
{
#if __SSE2__
    support_packing = true;
#if __AVX2__
    support_weight_fp16_storage = true;
#endif
#endif // __SSE2__

    activation = 0;
    convolution_dilation1 = 0;
}